

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoAssignUnique(Gia_IsoMan_t *p)

{
  int Entry;
  Vec_Int_t *pVVar1;
  int iVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  iVar2 = 0;
  p->nSingles = 0;
  pVVar4 = p->vClasses2;
  pVVar4->nSize = 0;
  pVVar1 = p->vClasses;
  if (1 < pVVar1->nSize) {
    lVar5 = 1;
    do {
      iVar2 = pVVar1->pArray[lVar5 + -1];
      Entry = pVVar1->pArray[lVar5];
      if (Entry == 1) {
        uVar3 = p->pStoreW[iVar2] >> 0x20;
        if (p->pUniques[uVar3] != 0) {
          __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIso.c"
                        ,0x112,"void Gia_IsoAssignUnique(Gia_IsoMan_t *)");
        }
        iVar2 = p->nUniques;
        p->nUniques = iVar2 + 1;
        p->pUniques[uVar3] = iVar2;
        p->nSingles = p->nSingles + 1;
      }
      else {
        Vec_IntPush(p->vClasses2,iVar2);
        Vec_IntPush(p->vClasses2,Entry);
        pVVar1 = p->vClasses;
      }
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < pVVar1->nSize);
    pVVar4 = p->vClasses2;
    iVar2 = p->nSingles;
  }
  p->vClasses = pVVar4;
  p->vClasses2 = pVVar1;
  p->nEntries = p->nEntries - iVar2;
  return;
}

Assistant:

void Gia_IsoAssignUnique( Gia_IsoMan_t * p )
{
    int i, iBegin, nSize;
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
        }
    }
    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
}